

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_hosts_file.c
# Opt level: O2

void ares_hosts_file_destroy(ares_hosts_file_t *hf)

{
  if (hf != (ares_hosts_file_t *)0x0) {
    ares_free(hf->filename);
    ares_htable_strvp_destroy(hf->hosthash);
    ares_htable_strvp_destroy(hf->iphash);
    ares_free(hf);
    return;
  }
  return;
}

Assistant:

void ares_hosts_file_destroy(ares_hosts_file_t *hf)
{
  if (hf == NULL) {
    return;
  }

  ares_free(hf->filename);
  ares_htable_strvp_destroy(hf->hosthash);
  ares_htable_strvp_destroy(hf->iphash);
  ares_free(hf);
}